

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::setJointConfiguration
          (InverseKinematics *this,string *jointName,double jointConfiguration)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::setJointConfiguration(const std::string& jointName, const double jointConfiguration)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->setJointConfiguration(jointName, jointConfiguration);
#else
        return missingIpoptErrorReport();
#endif
    }